

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O2

void __thiscall SM83::push_rr<(SM83::Registers)8>(SM83 *this)

{
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_std::basic_string_view<char>_>
  fmt;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  unsigned_short local_18 [4];
  char *local_10;
  
  local_18[0] = 2;
  local_18[1] = 0;
  local_18[2] = 0;
  local_18[3] = 0;
  local_10 = "AF";
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x45;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,std::basic_string_view<char,std::char_traits<char>>>
            ((v11 *)"AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  PUSH {}\n",fmt,
             &(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,local_18,in_stack_ffffffffffffffe0);
  StackPush(this,(this->field_0).af);
  Timer::AdvanceCycles(this->timer,4);
  return;
}

Assistant:

void SM83::push_rr() {
    LTRACE("PUSH {}", Get16bitRegisterName<Register>());
    StackPush(Get16bitRegister<Register>());

    timer.AdvanceCycles(4);
}